

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O3

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  double dVar66;
  ulong local_1b8;
  
  if (0 < ncomp) {
    dVar1 = (geom->super_CoordSys).inv_dx[0];
    dVar2 = (geom->super_CoordSys).inv_dx[1];
    dVar3 = (geom->super_CoordSys).inv_dx[2];
    pdVar24 = fy->p;
    lVar25 = fy->jstride;
    pdVar26 = fz->p;
    lVar27 = fz->jstride;
    lVar28 = fz->kstride;
    lVar29 = fz->nstride;
    iVar5 = (fz->begin).z;
    iVar6 = (fz->begin).y;
    lVar58 = (long)(fz->begin).x;
    lVar30 = fy->kstride;
    lVar31 = fy->nstride;
    iVar7 = (fy->begin).y;
    iVar8 = (fy->begin).z;
    iVar9 = (fy->begin).x;
    pdVar32 = fx->p;
    lVar33 = fx->jstride;
    lVar34 = fx->kstride;
    lVar35 = fx->nstride;
    iVar10 = (fx->begin).x;
    iVar11 = (fx->begin).z;
    iVar12 = (fx->begin).y;
    pdVar36 = div->p;
    lVar37 = div->jstride;
    lVar38 = div->kstride;
    lVar39 = div->nstride;
    iVar13 = (div->begin).z;
    iVar14 = (div->begin).y;
    lVar59 = (long)(div->begin).x;
    pdVar40 = vfrac->p;
    lVar41 = vfrac->jstride;
    lVar42 = vfrac->kstride;
    iVar15 = (vfrac->begin).z;
    iVar16 = (vfrac->begin).y;
    iVar17 = (vfrac->begin).x;
    iVar18 = (bx->smallend).vect[2];
    iVar19 = (bx->bigend).vect[2];
    iVar20 = (bx->bigend).vect[0];
    iVar21 = (bx->bigend).vect[1];
    iVar22 = (bx->smallend).vect[1];
    iVar23 = (bx->smallend).vect[0];
    local_1b8 = 0;
    do {
      if (iVar18 <= iVar19) {
        lVar46 = local_1b8 * lVar39;
        lVar47 = local_1b8 * lVar35;
        lVar48 = local_1b8 * lVar31;
        lVar60 = local_1b8 * lVar29;
        iVar45 = iVar18;
        do {
          if (iVar22 <= iVar21) {
            lVar49 = (long)iVar45;
            lVar52 = (lVar49 - iVar13) * lVar38;
            lVar53 = (lVar49 - iVar11) * lVar34;
            lVar54 = (lVar49 - iVar8) * lVar30;
            lVar65 = ((iVar45 + 1) - iVar5) * lVar28;
            lVar50 = (iVar45 - iVar5) * lVar28;
            lVar57 = (long)iVar22;
            do {
              iVar44 = (int)lVar57;
              if (iVar23 <= iVar20) {
                lVar51 = (lVar57 - iVar14) * lVar37;
                lVar61 = (lVar57 - iVar12) * lVar33;
                lVar62 = (lVar57 - iVar7) * lVar25;
                lVar55 = (lVar57 - iVar6) * lVar27;
                lVar56 = (long)iVar23;
                do {
                  dVar4 = pdVar40[(lVar49 - iVar15) * lVar42 +
                                  (lVar57 - iVar16) * lVar41 + (lVar56 - iVar17)];
                  iVar43 = (int)lVar56;
                  if (dVar4 <= 0.0) {
                    pdVar36[lVar46 + lVar52 + lVar51 + (lVar56 - lVar59)] = 0.0;
                  }
                  else {
                    dVar66 = pdVar32[lVar47 + lVar53 + lVar61 + ((iVar43 + 1) - iVar10)] -
                             pdVar32[lVar47 + lVar53 + lVar61 + (lVar56 - iVar10)];
                    lVar63 = lVar56 - iVar9;
                    if (fluxes_are_area_weighted) {
                      lVar64 = lVar56 - lVar58;
                      pdVar36[lVar46 + lVar52 + lVar51 + (lVar56 - lVar59)] =
                           ((((dVar66 + pdVar24[lVar48 + lVar54 + ((iVar44 + 1) - iVar7) * lVar25 +
                                                                  lVar63]) -
                             pdVar24[lVar48 + lVar54 + lVar62 + lVar63]) +
                            pdVar26[lVar55 + lVar64 + lVar65 + lVar60]) -
                           pdVar26[lVar55 + lVar64 + lVar50 + lVar60]) *
                           ((dVar1 * dVar2 * dVar3 * mult) / dVar4);
                    }
                    else {
                      lVar64 = lVar56 - lVar58;
                      pdVar36[lVar46 + lVar52 + lVar51 + (lVar56 - lVar59)] =
                           ((pdVar26[lVar55 + lVar64 + lVar65 + lVar60] -
                            pdVar26[lVar55 + lVar64 + lVar50 + lVar60]) * dVar3 +
                           dVar66 * dVar1 +
                           (pdVar24[lVar48 + lVar54 + ((iVar44 + 1) - iVar7) * lVar25 + lVar63] -
                           pdVar24[lVar48 + lVar54 + lVar62 + lVar63]) * dVar2) * (mult / dVar4);
                    }
                  }
                  lVar56 = lVar56 + 1;
                } while (iVar43 + 1 != iVar20 + 1);
              }
              lVar57 = lVar57 + 1;
            } while (iVar44 + 1 != iVar21 + 1);
          }
          iVar45 = iVar45 + 1;
        } while (iVar45 != iVar19 + 1);
      }
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != (uint)ncomp);
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted )
{
    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM==3)
    Real qvol = dxinv[0] * dxinv[1] * dxinv[2];
#else
    Real qvol = dxinv[0] * dxinv[1];
#endif

    amrex::ParallelFor(bx, ncomp, [=]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if ( vfrac(i,j,k) > 0.)
        {
            if (fluxes_are_area_weighted)
                div(i,j,k,n) =  mult * qvol / vfrac(i,j,k) *
                    (
                             fx(i+1,j,k,n) -  fx(i,j,k,n)
                           + fy(i,j+1,k,n) -  fy(i,j,k,n)
#if (AMREX_SPACEDIM==3)
                           + fz(i,j,k+1,n) -  fz(i,j,k,n)
#endif
                    );
            else
                div(i,j,k,n) =  mult / vfrac(i,j,k) *
                    (
                             (fx(i+1,j,k,n) -  fx(i,j,k,n)) * dxinv[0]
                           + (fy(i,j+1,k,n) -  fy(i,j,k,n)) * dxinv[1]
#if (AMREX_SPACEDIM==3)
                           + (fz(i,j,k+1,n) -  fz(i,j,k,n)) * dxinv[2]
#endif
                    );
        }
        else
        {
            div(i,j,k,n) = 0.0;
        }

    });
}